

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O1

void ggml_backend_sched_split_graph(ggml_backend_sched_t sched,ggml_cgraph *graph)

{
  int iVar1;
  ggml_tensor *pgVar2;
  ggml_backend_dev_t pgVar3;
  int *piVar4;
  ggml_tensor *pgVar5;
  ggml_backend_sched_split *pgVar6;
  ggml_init_params params;
  _Bool _Var7;
  int iVar8;
  ggml_context *pgVar9;
  size_t sVar10;
  ulong uVar11;
  size_t sVar12;
  int *piVar13;
  ggml_backend_sched_split *pgVar14;
  ggml_tensor *pgVar15;
  char *pcVar16;
  ggml_tensor **ppgVar17;
  long lVar18;
  char *pcVar19;
  uint uVar20;
  long lVar21;
  ggml_backend_t pgVar22;
  bool bVar23;
  int j_2;
  int iVar24;
  ggml_cgraph *pgVar25;
  ggml_cgraph *pgVar26;
  ggml_hash_set *pgVar27;
  int j_3;
  int iVar28;
  long lVar29;
  ulong uVar30;
  int j;
  long lVar31;
  int *piVar32;
  byte bVar33;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 uVar34;
  uint uVar35;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar37;
  undefined4 uVar38;
  ggml_hash_set *pgVar36;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined8 in_stack_ffffffffffffff30;
  int local_c4;
  ggml_backend_sched_split *local_b8;
  ggml_cgraph local_80;
  
  bVar33 = 0;
  sched->n_splits = 0;
  sched->n_graph_inputs = 0;
  sched->is_reset = false;
  ggml_free(sched->ctx);
  params.mem_size._4_4_ = in_stack_ffffffffffffff24;
  params.mem_size._0_4_ = in_stack_ffffffffffffff20;
  params.mem_buffer._0_4_ = in_stack_ffffffffffffff28;
  params.mem_buffer._4_4_ = in_stack_ffffffffffffff2c;
  params._16_8_ = in_stack_ffffffffffffff30;
  pgVar9 = ggml_init(params);
  sched->ctx = pgVar9;
  if (pgVar9 == (ggml_context *)0x0) {
    pcVar16 = "%s: failed to initialize context\n";
    pcVar19 = "ggml_backend_sched_split_graph";
    iVar8 = 0x36f;
  }
  else {
    if (0 < graph->n_leafs) {
      lVar29 = 0;
      do {
        pgVar2 = graph->leafs[lVar29];
        piVar32 = sched->hv_tensor_backend_ids;
        sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
        if (piVar32[sVar10] == -1) {
          iVar8 = ggml_backend_sched_backend_id_from_cur(sched,pgVar2);
          piVar32[sVar10] = iVar8;
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 < graph->n_leafs);
    }
    if (0 < graph->n_nodes) {
      lVar29 = 0;
      do {
        pgVar2 = graph->nodes[lVar29];
        piVar32 = sched->hv_tensor_backend_ids;
        sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
        if (piVar32[sVar10] == -1) {
          iVar8 = ggml_backend_sched_backend_id_from_cur(sched,pgVar2);
          piVar32[sVar10] = iVar8;
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 < graph->n_nodes);
    }
    uVar20 = graph->n_nodes;
    if (0 < (int)uVar20) {
      lVar29 = 0;
      iVar8 = -1;
      do {
        pgVar2 = graph->nodes[lVar29];
        iVar28 = iVar8;
        if (3 < pgVar2->op - GGML_OP_RESHAPE) {
          piVar32 = sched->hv_tensor_backend_ids;
          sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
          iVar28 = piVar32[sVar10];
          if (iVar28 == -1) {
            if (iVar8 == -1) {
              iVar28 = -1;
            }
            else {
              pgVar3 = sched->backends[iVar8]->device;
              _Var7 = (*(pgVar3->iface).supports_op)(pgVar3,pgVar2);
              iVar28 = iVar8;
              if (_Var7) {
                piVar32[sVar10] = iVar8;
              }
            }
          }
          else if (iVar28 == sched->n_backends + -1) {
            iVar28 = -1;
          }
        }
        lVar29 = lVar29 + 1;
        uVar20 = graph->n_nodes;
        iVar8 = iVar28;
      } while (lVar29 < (int)uVar20);
    }
    if (0 < (int)uVar20) {
      lVar29 = (ulong)uVar20 + 1;
      iVar8 = -1;
      do {
        pgVar2 = graph->nodes[lVar29 + -2];
        iVar28 = iVar8;
        if (3 < pgVar2->op - GGML_OP_RESHAPE) {
          piVar32 = sched->hv_tensor_backend_ids;
          sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
          iVar28 = piVar32[sVar10];
          if (iVar28 == -1) {
            if (iVar8 == -1) {
              iVar28 = -1;
            }
            else {
              pgVar3 = sched->backends[iVar8]->device;
              _Var7 = (*(pgVar3->iface).supports_op)(pgVar3,pgVar2);
              iVar28 = iVar8;
              if (_Var7) {
                piVar32[sVar10] = iVar8;
              }
            }
          }
          else if (iVar28 == sched->n_backends + -1) {
            iVar28 = -1;
          }
        }
        lVar29 = lVar29 + -1;
        iVar8 = iVar28;
      } while (1 < lVar29);
    }
    uVar20 = graph->n_nodes;
    if (0 < (int)uVar20) {
      iVar8 = -1;
      lVar29 = 0;
      do {
        pgVar2 = graph->nodes[lVar29];
        iVar28 = iVar8;
        if (3 < pgVar2->op - GGML_OP_RESHAPE) {
          piVar32 = sched->hv_tensor_backend_ids;
          sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
          iVar28 = piVar32[sVar10];
          if (iVar28 == -1) {
            if (iVar8 == -1) {
              iVar28 = -1;
            }
            else {
              pgVar3 = sched->backends[iVar8]->device;
              _Var7 = (*(pgVar3->iface).supports_op)(pgVar3,pgVar2);
              iVar28 = iVar8;
              if (_Var7) {
                piVar32[sVar10] = iVar8;
              }
            }
          }
        }
        iVar8 = iVar28;
        lVar29 = lVar29 + 1;
        uVar20 = graph->n_nodes;
      } while (lVar29 < (int)uVar20);
    }
    if (0 < (int)uVar20) {
      lVar29 = (ulong)uVar20 + 1;
      iVar8 = -1;
      do {
        pgVar2 = graph->nodes[lVar29 + -2];
        iVar28 = iVar8;
        if (3 < pgVar2->op - GGML_OP_RESHAPE) {
          piVar32 = sched->hv_tensor_backend_ids;
          sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
          iVar28 = piVar32[sVar10];
          if (iVar28 == -1) {
            if (iVar8 == -1) {
              iVar28 = -1;
            }
            else {
              pgVar3 = sched->backends[iVar8]->device;
              _Var7 = (*(pgVar3->iface).supports_op)(pgVar3,pgVar2);
              iVar28 = iVar8;
              if (_Var7) {
                piVar32[sVar10] = iVar8;
              }
            }
          }
        }
        lVar29 = lVar29 + -1;
        iVar8 = iVar28;
      } while (1 < lVar29);
    }
    if (0 < graph->n_nodes) {
      pgVar27 = &sched->hash_set;
      lVar29 = 0;
      do {
        pgVar2 = graph->nodes[lVar29];
        if (3 < pgVar2->op - GGML_OP_RESHAPE) {
          piVar32 = sched->hv_tensor_backend_ids;
          sVar10 = ggml_hash_find_or_insert(pgVar27,pgVar2);
          uVar34 = SUB84(piVar32,0);
          uVar38 = (undefined4)((ulong)piVar32 >> 0x20);
          if (piVar32[sVar10] == -1) {
            if (0 < sched->n_backends) {
              iVar8 = -1;
              lVar21 = 0;
              do {
                pgVar3 = sched->backends[lVar21]->device;
                _Var7 = (*(pgVar3->iface).supports_op)(pgVar3,pgVar2);
                if (_Var7) {
                  iVar24 = (int)lVar21;
                  uVar37 = (undefined4)((ulong)lVar21 >> 0x20);
                  lVar21 = 0;
                  iVar28 = 0;
                  do {
                    pgVar5 = pgVar2->src[lVar21];
                    if ((pgVar5 != (ggml_tensor *)0x0) &&
                       ((piVar32 = sched->hv_tensor_backend_ids,
                        sVar12 = ggml_hash_find_or_insert(pgVar27,pgVar5), piVar32[sVar12] != -1 ||
                        (piVar32 = sched->hv_tensor_backend_ids,
                        sVar12 = ggml_hash_find_or_insert(pgVar27,pgVar5->view_src),
                        piVar32[sVar12] != -1)))) {
                      _Var7 = ggml_backend_sched_buffer_supported(sched,pgVar5,iVar24);
                      iVar28 = iVar28 + (uint)_Var7;
                    }
                    lVar21 = lVar21 + 1;
                  } while (lVar21 != 10);
                  lVar21 = CONCAT44(uVar37,iVar24);
                  if (iVar8 < iVar28) {
                    *(int *)(CONCAT44(uVar38,uVar34) + sVar10 * 4) = iVar24;
                    iVar8 = iVar28;
                  }
                }
                lVar21 = lVar21 + 1;
              } while (lVar21 < sched->n_backends);
            }
          }
          else {
            uVar11 = (ulong)(uint)piVar32[sVar10];
            if (0 < piVar32[sVar10]) {
              lVar21 = 0;
              do {
                if ((sched->bufts[lVar21] == sched->bufts[(int)uVar11]) &&
                   (pgVar3 = sched->backends[lVar21]->device,
                   _Var7 = (*(pgVar3->iface).supports_op)(pgVar3,pgVar2), _Var7)) {
                  bVar23 = true;
                  lVar31 = 0;
                  do {
                    if (pgVar2->src[lVar31] == (ggml_tensor *)0x0) {
                      iVar8 = 0x22;
                    }
                    else {
                      _Var7 = ggml_backend_sched_buffer_supported
                                        (sched,pgVar2->src[lVar31],(int)lVar21);
                      if (!_Var7) {
                        bVar23 = false;
                      }
                      iVar8 = (uint)!_Var7 << 5;
                    }
                  } while (((iVar8 == 0x22) || (iVar8 == 0)) && (lVar31 = lVar31 + 1, lVar31 != 10))
                  ;
                  piVar32 = (int *)CONCAT44(uVar38,uVar34);
                  if (bVar23) {
                    piVar32[sVar10] = (int)lVar21;
                    break;
                  }
                }
                lVar21 = lVar21 + 1;
                uVar11 = (ulong)piVar32[sVar10];
              } while (lVar21 < (long)uVar11);
            }
          }
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 < graph->n_nodes);
    }
    if (0 < graph->n_nodes) {
      pgVar27 = &sched->hash_set;
      lVar29 = 0;
      do {
        pgVar2 = graph->nodes[lVar29];
        piVar32 = sched->hv_tensor_backend_ids;
        sVar10 = ggml_hash_find_or_insert(pgVar27,pgVar2);
        piVar32 = piVar32 + sVar10;
        if ((pgVar2->view_src != (ggml_tensor *)0x0) && (*piVar32 == -1)) {
          piVar4 = sched->hv_tensor_backend_ids;
          sVar10 = ggml_hash_find_or_insert(pgVar27,pgVar2->view_src);
          *piVar32 = piVar4[sVar10];
        }
        lVar21 = 0;
        do {
          pgVar5 = pgVar2->src[lVar21];
          if (pgVar5 != (ggml_tensor *)0x0) {
            piVar4 = sched->hv_tensor_backend_ids;
            piVar13 = piVar32;
            sVar10 = ggml_hash_find_or_insert(pgVar27,pgVar5);
            piVar32 = piVar13;
            if (piVar4[sVar10] == -1) {
              if (pgVar5->view_src != (ggml_tensor *)0x0) {
                piVar13 = sched->hv_tensor_backend_ids;
                sVar12 = ggml_hash_find_or_insert(pgVar27,pgVar5->view_src);
                piVar13 = piVar13 + sVar12;
              }
              piVar4[sVar10] = *piVar13;
            }
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != 10);
        lVar29 = lVar29 + 1;
      } while (lVar29 < graph->n_nodes);
    }
    local_b8 = sched->splits;
    uVar20 = graph->n_nodes;
    uVar11 = 0;
    if (0 < (int)uVar20) {
      uVar11 = 0;
      do {
        if (3 < graph->nodes[uVar11]->op - GGML_OP_RESHAPE) {
          piVar32 = sched->hv_tensor_backend_ids;
          sVar10 = ggml_hash_find_or_insert(&sched->hash_set,graph->nodes[uVar11]);
          local_b8->backend_id = piVar32[sVar10];
          goto LAB_00126a8e;
        }
        uVar11 = uVar11 + 1;
      } while (uVar20 != uVar11);
      uVar11 = (ulong)uVar20;
    }
LAB_00126a8e:
    local_b8->i_start = 0;
    local_b8->n_inputs = 0;
    iVar8 = graph->n_nodes;
    if ((int)uVar11 < iVar8) {
      iVar28 = local_b8->backend_id;
      pgVar27 = &sched->hash_set;
      uVar11 = uVar11 & 0xffffffff;
      local_c4 = 0;
      do {
        pgVar2 = graph->nodes[uVar11];
        if (3 < pgVar2->op - GGML_OP_RESHAPE) {
          piVar32 = sched->hv_tensor_backend_ids;
          sVar10 = ggml_hash_find_or_insert(pgVar27,pgVar2);
          iVar8 = piVar32[sVar10];
          if (iVar8 == iVar28) {
            if (0 < local_b8->n_inputs) {
              lVar29 = 0;
              uVar20 = 0;
              do {
                pgVar5 = pgVar2->src[lVar29];
                if (pgVar5 == (ggml_tensor *)0x0) {
                  iVar24 = 0x31;
                }
                else {
                  if ((pgVar5->buffer != (ggml_backend_buffer *)0x0) &&
                     (pgVar5->buffer->usage == GGML_BACKEND_BUFFER_USAGE_WEIGHTS)) {
                    piVar32 = sched->hv_tensor_backend_ids;
                    sVar10 = ggml_hash_find_or_insert(pgVar27,pgVar5);
                    if ((piVar32[sVar10] == iVar28) ||
                       (_Var7 = ggml_backend_sched_buffer_supported(sched,pgVar5,iVar28), _Var7)) {
                      iVar24 = 0;
                      bVar23 = true;
                    }
                    else {
                      iVar24 = 0x2f;
                      uVar20 = 1;
                      bVar23 = false;
                    }
                    if (!bVar23) goto LAB_00126c1a;
                  }
                  iVar24 = 0;
                  if (local_b8->n_inputs == 10) {
                    sVar10 = ggml_hash_find_or_insert(pgVar27,pgVar5);
                    iVar1 = sched->hv_tensor_backend_ids[sVar10];
                    _Var7 = ggml_backend_sched_buffer_supported(sched,pgVar5,iVar28);
                    if ((iVar1 != iVar28) &&
                       ((~_Var7 & sched->hv_tensor_copies
                                  [sVar10 * (long)sched->n_backends * (long)sched->n_copies +
                                   (long)iVar28 * (long)sched->n_copies] == (ggml_tensor *)0x0) != 0
                       )) {
                      iVar24 = 0x2f;
                      uVar20 = 1;
                    }
                  }
                }
LAB_00126c1a:
              } while (((iVar24 == 0x31) || (iVar24 == 0)) && (lVar29 = lVar29 + 1, lVar29 != 10));
              if ((uVar20 & 1) != 0) goto LAB_00126c40;
            }
          }
          else {
LAB_00126c40:
            iVar28 = iVar8;
            local_b8->i_end = (int)uVar11;
            local_c4 = local_c4 + 1;
            iVar8 = sched->splits_capacity;
            if (iVar8 <= local_c4) {
              sched->splits_capacity = iVar8 * 2;
              pgVar14 = (ggml_backend_sched_split *)realloc(sched->splits,(long)iVar8 * 0x170);
              sched->splits = pgVar14;
              if (pgVar14 == (ggml_backend_sched_split *)0x0) {
                pcVar16 = "GGML_ASSERT(%s) failed";
                pcVar19 = "sched->splits != NULL";
                iVar8 = 0x480;
                goto LAB_00127806;
              }
            }
            pgVar14 = sched->splits;
            local_b8 = pgVar14 + local_c4;
            pgVar14[local_c4].backend_id = iVar28;
            pgVar14[local_c4].i_start = (int)uVar11;
            pgVar14[local_c4].n_inputs = 0;
          }
          lVar21 = (long)iVar28;
          lVar29 = 0;
          iVar8 = iVar28;
          do {
            pgVar5 = pgVar2->src[lVar29];
            if (pgVar5 != (ggml_tensor *)0x0) {
              uVar34 = (undefined4)lVar29;
              uVar38 = (undefined4)((ulong)lVar29 >> 0x20);
              sVar10 = ggml_hash_find_or_insert(pgVar27,pgVar5);
              iVar24 = sched->hv_tensor_backend_ids[sVar10];
              iVar28 = iVar8;
              if ((pgVar5->flags & 1) != 0) {
                iVar1 = sched->n_copies;
                if ((1 < (long)iVar1) &&
                   (sched->hv_tensor_copies
                    [(long)iVar1 * sVar10 * (long)sched->n_backends + (long)(iVar1 * iVar24)] ==
                    (ggml_tensor *)0x0)) {
                  if (0 < sched->n_copies) {
                    pgVar22 = sched->backends[iVar24];
                    uVar30 = 0;
                    do {
                      pgVar15 = pgVar5;
                      if (uVar30 != (uint)sched->cur_copy) {
                        pgVar15 = ggml_dup_tensor(sched->ctx,pgVar5);
                        lVar29 = 6;
                        do {
                          pgVar15->ne[lVar29 + -2] = pgVar5->ne[lVar29 + -2];
                          lVar29 = lVar29 + 1;
                        } while (lVar29 != 10);
                        pcVar19 = "NULL";
                        if (pgVar22 != (ggml_backend_t)0x0) {
                          pcVar19 = (*(pgVar22->iface).get_name)(pgVar22);
                        }
                        ggml_format_name(pgVar15,"%s#%s#%d",pcVar19,pgVar5->name,uVar30 & 0xffffffff
                                        );
                      }
                      if (1 < sched->n_copies) {
                        ggml_set_input(pgVar15);
                        ggml_set_output(pgVar15);
                      }
                      sched->hv_tensor_copies
                      [(long)sched->n_backends * sVar10 * (long)sched->n_copies +
                       (long)sched->n_copies * (long)iVar24 + uVar30] = pgVar15;
                      uVar30 = uVar30 + 1;
                    } while ((long)uVar30 < (long)sched->n_copies);
                  }
                  iVar28 = sched->n_graph_inputs;
                  sched->n_graph_inputs = iVar28 + 1;
                  if (9 < (long)iVar28) {
                    pcVar16 = "GGML_ASSERT(%s) failed";
                    pcVar19 = "n_graph_inputs < GGML_SCHED_MAX_SPLIT_INPUTS";
                    iVar8 = 0x4a7;
                    goto LAB_00127806;
                  }
                  sched->graph_inputs[iVar28] = pgVar5;
                  iVar28 = iVar8;
                }
              }
              lVar29 = CONCAT44(uVar38,uVar34);
              iVar8 = iVar28;
              if (iVar24 != iVar28) {
                _Var7 = ggml_backend_sched_buffer_supported(sched,pgVar5,iVar28);
                lVar29 = CONCAT44(uVar38,uVar34);
                if (!_Var7) {
                  if (sched->hv_tensor_copies
                      [(long)sched->n_backends * (long)sched->n_copies * sVar10 +
                       sched->n_copies * lVar21] == (ggml_tensor *)0x0) {
                    iVar28 = iVar8;
                    if (0 < sched->n_copies) {
                      pgVar22 = sched->backends[lVar21];
                      uVar30 = 0;
                      do {
                        pgVar15 = ggml_dup_tensor(sched->ctx,pgVar5);
                        lVar29 = 6;
                        do {
                          pgVar15->ne[lVar29 + -2] = pgVar5->ne[lVar29 + -2];
                          lVar29 = lVar29 + 1;
                        } while (lVar29 != 10);
                        pcVar19 = "NULL";
                        if (pgVar22 != (ggml_backend_t)0x0) {
                          pcVar19 = (*(pgVar22->iface).get_name)(pgVar22);
                        }
                        ggml_format_name(pgVar15,"%s#%s#%d",pcVar19,pgVar5->name,uVar30 & 0xffffffff
                                        );
                        if (1 < sched->n_copies) {
                          ggml_set_input(pgVar15);
                          ggml_set_output(pgVar15);
                        }
                        sched->hv_tensor_copies
                        [(long)sched->n_backends * sVar10 * (long)sched->n_copies +
                         sched->n_copies * lVar21 + uVar30] = pgVar15;
                        uVar30 = uVar30 + 1;
                      } while ((long)uVar30 < (long)sched->n_copies);
                    }
                    iVar8 = local_b8->n_inputs;
                    local_b8->n_inputs = iVar8 + 1;
                    if (9 < (long)iVar8) {
                      pcVar16 = "GGML_ASSERT(%s) failed";
                      pcVar19 = "n_inputs < GGML_SCHED_MAX_SPLIT_INPUTS";
                      iVar8 = 0x4bb;
                      goto LAB_00127806;
                    }
                    local_b8->inputs[iVar8] = pgVar5;
                    lVar29 = CONCAT44(uVar38,uVar34);
                    iVar8 = iVar28;
                  }
                  pgVar2->src[lVar29] =
                       sched->hv_tensor_copies
                       [sVar10 * (long)sched->n_backends * (long)sched->n_copies +
                        sched->n_copies * lVar21 + (long)sched->cur_copy];
                }
              }
            }
            lVar29 = lVar29 + 1;
          } while (lVar29 != 10);
        }
        uVar11 = uVar11 + 1;
        iVar8 = graph->n_nodes;
      } while ((int)uVar11 < iVar8);
      local_c4 = local_c4 + 1;
    }
    else {
      local_c4 = 1;
    }
    local_b8->i_end = iVar8;
    sched->n_splits = local_c4;
    if ((0 < iVar8) && (sched->debug != 0)) {
      uVar11 = 0;
      uVar20 = 0;
      do {
        if ((int)uVar20 < sched->n_splits) {
          if (uVar11 == (uint)sched->splits[(int)uVar20].i_start) {
            pgVar22 = sched->backends[sched->splits[(int)uVar20].backend_id];
            pcVar19 = "NULL";
            if (pgVar22 != (ggml_backend_t)0x0) {
              pcVar19 = (*(pgVar22->iface).get_name)(pgVar22);
            }
            uVar35 = uVar20;
            ggml_log_internal(GGML_LOG_LEVEL_DEBUG,"\n## SPLIT #%d: %s # %d inputs",(ulong)uVar20,
                              pcVar19,(ulong)(uint)sched->splits[(int)uVar20].n_inputs);
            if (0 < sched->splits[(int)uVar20].n_inputs) {
              lVar29 = 0;
              do {
                if (lVar29 == 0) {
                  ggml_log_internal(GGML_LOG_LEVEL_DEBUG,": ");
                }
                pgVar2 = sched->splits[(int)uVar20].inputs[lVar29];
                sVar10 = ggml_nbytes(pgVar2);
                fmt_size(sVar10);
                ggml_log_internal(GGML_LOG_LEVEL_DEBUG,"[%s (%5.5s)] ",pgVar2->name,fmt_size::buffer
                                 );
                lVar29 = lVar29 + 1;
              } while (lVar29 < sched->splits[(int)uVar20].n_inputs);
            }
            ggml_log_internal(GGML_LOG_LEVEL_DEBUG,"\n");
            uVar20 = uVar35 + 1;
          }
        }
        pgVar2 = graph->nodes[uVar11];
        if ((3 < pgVar2->op - GGML_OP_RESHAPE) && (1 < sched->debug)) {
          piVar32 = sched->hv_tensor_backend_ids;
          sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
          if ((long)piVar32[sVar10] == -1) {
            pgVar22 = (ggml_backend_t)0x0;
          }
          else {
            pgVar22 = sched->backends[piVar32[sVar10]];
          }
          pcVar19 = ggml_op_name(pgVar2->op);
          sVar10 = ggml_nbytes(pgVar2);
          fmt_size(sVar10);
          pcVar16 = "NULL";
          if (pgVar22 != (ggml_backend_t)0x0) {
            pcVar16 = (*(pgVar22->iface).get_name)(pgVar22);
          }
          ggml_log_internal(GGML_LOG_LEVEL_DEBUG,
                            "node #%3d (%10.10s): %20.20s (%5.5s) [%5.5s %8.8s]:",
                            uVar11 & 0xffffffff,pcVar19,pgVar2->name,fmt_size::buffer,pcVar16,"");
          lVar29 = 0;
          do {
            pgVar5 = pgVar2->src[lVar29];
            if (pgVar5 != (ggml_tensor *)0x0) {
              piVar32 = sched->hv_tensor_backend_ids;
              sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar5);
              if ((long)piVar32[sVar10] == -1) {
                pgVar22 = (ggml_backend_t)0x0;
              }
              else {
                pgVar22 = sched->backends[piVar32[sVar10]];
              }
              sVar10 = ggml_nbytes(pgVar5);
              fmt_size(sVar10);
              pcVar19 = "NULL";
              if (pgVar22 != (ggml_backend_t)0x0) {
                pcVar19 = (*(pgVar22->iface).get_name)(pgVar22);
              }
              ggml_log_internal(GGML_LOG_LEVEL_DEBUG," %20.20s (%5.5s) [%5.5s %8.8s]",pgVar5->name,
                                fmt_size::buffer,pcVar19,"");
            }
            lVar29 = lVar29 + 1;
          } while (lVar29 != 10);
          ggml_log_internal(GGML_LOG_LEVEL_DEBUG,"\n");
        }
        uVar11 = uVar11 + 1;
      } while ((long)uVar11 < (long)graph->n_nodes);
    }
    piVar32 = sched->node_backend_ids;
    piVar4 = sched->leaf_backend_ids;
    sched->node_backend_ids = sched->prev_node_backend_ids;
    sched->leaf_backend_ids = sched->prev_leaf_backend_ids;
    sched->prev_node_backend_ids = piVar32;
    sched->prev_leaf_backend_ids = piVar4;
    iVar8 = graph->n_leafs;
    if (graph->n_leafs < graph->n_nodes) {
      iVar8 = graph->n_nodes;
    }
    iVar8 = iVar8 + sched->n_splits * sched->n_copies * 0x14;
    if (iVar8 <= (sched->graph).size) {
LAB_00127394:
      (sched->graph).n_nodes = 0;
      (sched->graph).n_leafs = 0;
      if (0 < sched->n_splits) {
        pgVar27 = &sched->hash_set;
        lVar29 = 0x10;
        lVar21 = 0;
        pgVar36 = pgVar27;
        do {
          pgVar6 = sched->splits;
          pgVar14 = pgVar6 + lVar21;
          lVar31 = lVar21;
          ggml_graph_view(&local_80,graph,pgVar6[lVar21].i_start,pgVar6[lVar21].i_end);
          pgVar25 = &local_80;
          pgVar26 = &pgVar6[lVar21].graph;
          for (lVar18 = 10; lVar18 != 0; lVar18 = lVar18 + -1) {
            iVar8 = pgVar25->n_nodes;
            pgVar26->size = pgVar25->size;
            pgVar26->n_nodes = iVar8;
            pgVar25 = (ggml_cgraph *)((long)pgVar25 + (ulong)bVar33 * -0x10 + 8);
            pgVar26 = (ggml_cgraph *)((long)pgVar26 + (ulong)bVar33 * -0x10 + 8);
          }
          lVar18 = lVar29;
          if (0 < pgVar6[lVar21].n_inputs) {
            lVar21 = 0;
            do {
              pgVar2 = *(ggml_tensor **)((long)pgVar6->inputs + lVar21 * 8 + lVar29 + -0x10);
              sVar10 = ggml_hash_find_or_insert(pgVar27,pgVar2);
              pgVar5 = sched->hv_tensor_copies
                       [(long)sched->n_backends * (long)sched->n_copies * sVar10 +
                        (long)pgVar14->backend_id * (long)sched->n_copies + (long)sched->cur_copy];
              pgVar27 = pgVar36;
              pgVar15 = ggml_view_tensor(sched->ctx,pgVar2);
              pgVar15->src[0] = pgVar2;
              sched->node_backend_ids[(sched->graph).n_nodes] = sched->hv_tensor_backend_ids[sVar10]
              ;
              iVar8 = (sched->graph).n_nodes;
              (sched->graph).n_nodes = iVar8 + 1;
              (sched->graph).nodes[iVar8] = pgVar15;
              sched->node_backend_ids[(long)iVar8 + 1] = pgVar14->backend_id;
              iVar8 = (sched->graph).n_nodes;
              (sched->graph).n_nodes = iVar8 + 1;
              (sched->graph).nodes[iVar8] = pgVar5;
              lVar21 = lVar21 + 1;
              pgVar36 = pgVar27;
            } while (lVar21 < pgVar14->n_inputs);
          }
          lVar29 = (long)pgVar14->i_start;
          if (pgVar14->i_start < pgVar14->i_end) {
            do {
              piVar32 = sched->hv_tensor_backend_ids;
              sVar10 = ggml_hash_find_or_insert(pgVar27,graph->nodes[lVar29]);
              sched->node_backend_ids[(sched->graph).n_nodes] = piVar32[sVar10];
              pgVar2 = graph->nodes[lVar29];
              iVar8 = (sched->graph).n_nodes;
              (sched->graph).n_nodes = iVar8 + 1;
              (sched->graph).nodes[iVar8] = pgVar2;
              lVar29 = lVar29 + 1;
            } while (lVar29 < pgVar14->i_end);
          }
          lVar21 = lVar31 + 1;
          lVar29 = lVar18 + 0xb8;
        } while (lVar21 < sched->n_splits);
      }
      if (1 < sched->n_copies) {
        if (0 < sched->n_graph_inputs) {
          lVar29 = 0;
          do {
            pgVar2 = sched->graph_inputs[lVar29];
            sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
            piVar32 = sched->hv_tensor_backend_ids;
            sVar12 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
            uVar11 = (ulong)(uint)sched->n_copies;
            if (0 < sched->n_copies) {
              iVar8 = piVar32[sVar12];
              lVar21 = 0;
              do {
                pgVar2 = sched->hv_tensor_copies
                         [sVar10 * (long)(int)uVar11 * (long)sched->n_backends +
                          (int)uVar11 * iVar8 + lVar21];
                sched->leaf_backend_ids[(sched->graph).n_leafs] = iVar8;
                iVar28 = (sched->graph).n_leafs;
                (sched->graph).n_leafs = iVar28 + 1;
                (sched->graph).leafs[iVar28] = pgVar2;
                lVar21 = lVar21 + 1;
                uVar11 = (ulong)sched->n_copies;
              } while (lVar21 < (long)uVar11);
            }
            lVar29 = lVar29 + 1;
          } while (lVar29 < sched->n_graph_inputs);
        }
        if (0 < sched->n_splits) {
          lVar29 = 0;
          do {
            pgVar14 = sched->splits;
            if (0 < pgVar14[lVar29].n_inputs) {
              iVar8 = pgVar14[lVar29].backend_id;
              lVar21 = 0;
              do {
                sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar14[lVar29].inputs[lVar21]);
                uVar11 = (ulong)(uint)sched->n_copies;
                if (0 < sched->n_copies) {
                  lVar31 = 0;
                  do {
                    pgVar2 = sched->hv_tensor_copies
                             [sVar10 * (long)(int)uVar11 * (long)sched->n_backends +
                              (int)uVar11 * iVar8 + lVar31];
                    sched->leaf_backend_ids[(sched->graph).n_leafs] = iVar8;
                    iVar28 = (sched->graph).n_leafs;
                    (sched->graph).n_leafs = iVar28 + 1;
                    (sched->graph).leafs[iVar28] = pgVar2;
                    lVar31 = lVar31 + 1;
                    uVar11 = (ulong)sched->n_copies;
                  } while (lVar31 < (long)uVar11);
                }
                lVar21 = lVar21 + 1;
              } while (lVar21 < pgVar14[lVar29].n_inputs);
            }
            lVar29 = lVar29 + 1;
          } while (lVar29 < sched->n_splits);
        }
      }
      if (0 < graph->n_leafs) {
        lVar29 = 0;
        do {
          pgVar2 = graph->leafs[lVar29];
          piVar32 = sched->hv_tensor_backend_ids;
          sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
          sched->leaf_backend_ids[(sched->graph).n_leafs] = piVar32[sVar10];
          iVar8 = (sched->graph).n_leafs;
          (sched->graph).n_leafs = iVar8 + 1;
          (sched->graph).leafs[iVar8] = pgVar2;
          lVar29 = lVar29 + 1;
        } while (lVar29 < graph->n_leafs);
      }
      return;
    }
    (sched->graph).size = iVar8;
    ppgVar17 = (ggml_tensor **)realloc((sched->graph).nodes,(long)iVar8 << 3);
    (sched->graph).nodes = ppgVar17;
    ppgVar17 = (ggml_tensor **)realloc((sched->graph).leafs,(long)iVar8 << 3);
    (sched->graph).leafs = ppgVar17;
    if ((sched->graph).nodes == (ggml_tensor **)0x0) {
      pcVar16 = "GGML_ASSERT(%s) failed";
      pcVar19 = "sched->graph.nodes != NULL";
      iVar8 = 0x4da;
    }
    else {
      if (ppgVar17 != (ggml_tensor **)0x0) goto LAB_00127394;
      pcVar16 = "GGML_ASSERT(%s) failed";
      pcVar19 = "sched->graph.leafs != NULL";
      iVar8 = 0x4db;
    }
  }
LAB_00127806:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
             ,iVar8,pcVar16,pcVar19);
}

Assistant:

static void ggml_backend_sched_split_graph(ggml_backend_sched_t sched, struct ggml_cgraph * graph) {
    // reset splits
    sched->n_splits = 0;
    sched->n_graph_inputs = 0;
    sched->is_reset = false;

    struct ggml_init_params params = {
        /* .mem_size =   */ sched->context_buffer_size,
        /* .mem_buffer = */ sched->context_buffer,
        /* .no_alloc =   */ true
    };

    ggml_free(sched->ctx);

    sched->ctx = ggml_init(params);
    if (sched->ctx == NULL) {
        GGML_ABORT("%s: failed to initialize context\n", __func__);
    }

    // pass 1: assign backends to ops with pre-allocated inputs
    for (int i = 0; i < graph->n_leafs; i++) {
        struct ggml_tensor * leaf = graph->leafs[i];
        int * leaf_backend_id = &tensor_backend_id(leaf);
        // do not overwrite user assignments
        if (*leaf_backend_id == -1) {
            *leaf_backend_id = ggml_backend_sched_backend_id_from_cur(sched, leaf);
        }
    }

    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        int * node_backend_id = &tensor_backend_id(node);
        // do not overwrite user assignments
        if (*node_backend_id == -1) {
            *node_backend_id = ggml_backend_sched_backend_id_from_cur(sched, node);

#if 0
            // src
            if (node->op == GGML_OP_NONE) {
                continue;
            }

            for (int j = 0; j < GGML_MAX_SRC; j++) {
                struct ggml_tensor * src = node->src[j];
                if (src == NULL) {
                    continue;
                }
                int * src_backend_id = &tensor_backend_id(src);
                if (*src_backend_id == -1) {
                    *src_backend_id = ggml_backend_sched_backend_id_from_cur(sched, src);
                }
            }
#endif
        }
    }

    // pass 2: expand current backend assignments
    // assign the same backend to adjacent nodes
    // expand gpu backends (i.e. non last prio) up and down, ignoring cpu (the lowest priority backend)
    // thus, cpu will never be used unless weights are on cpu, or there are no gpu ops between cpu ops
    // ops unsupported by the backend being expanded will be left unassigned so that they can be assigned later when the locations of its inputs are known
    // expand gpu down
    {
        int cur_backend_id = -1;
        for (int i = 0; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                if (*node_backend_id == sched->n_backends - 1) {
                    // skip cpu (lowest prio backend)
                    cur_backend_id = -1;
                } else {
                    cur_backend_id = *node_backend_id;
                }
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }
    // expand gpu up
    {
        int cur_backend_id = -1;
        for (int i = graph->n_nodes - 1; i >= 0; i--) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                if (*node_backend_id == sched->n_backends - 1) {
                    // skip cpu (lowest prio backend)
                    cur_backend_id = -1;
                } else {
                    cur_backend_id = *node_backend_id;
                }
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }
    // expand rest down
    {
        int cur_backend_id = -1;
        for (int i = 0; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                cur_backend_id = *node_backend_id;
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }
    // expand rest up
    {
        int cur_backend_id = -1;
        for (int i = graph->n_nodes - 1; i >= 0; i--) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                cur_backend_id = *node_backend_id;
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }

    // pass 3: upgrade nodes to higher prio backends with compatible buffer types
    // if the tensor is already in the same buffer type (*) as another higher priority backend, we should move it there
    // however, we also need to verify that the sources are in compatible buffer types
    // (*) the actual requirement is more relaxed, the buffer type of the backend should be supported by all the users of this tensor further down the graph
    // however, this is slow to verify, so we have a more strict requirement that the buffer type is the same
    // this is not uncommon since multiple backends can use host memory, with the same buffer type (eg. BLAS and CPU)
    // additionally, set remaining unassigned nodes to the backend with the most supported inputs
    // only nodes that could not be assigned during expansion due to the backend not supporting the op should be unassigned at this point
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        if (ggml_is_view_op(node->op)) {
            continue;
        }
        int * node_backend_id = &tensor_backend_id(node);
        if (*node_backend_id == -1) {
            // unassigned node: find the backend with the most supported inputs
            int n_supported_best = -1;
            for (int b = 0; b < sched->n_backends; b++) {
                if (ggml_backend_supports_op(sched->backends[b], node)) {
                    int n_supported = 0;
                    for (int j = 0; j < GGML_MAX_SRC; j++) {
                        struct ggml_tensor * src = node->src[j];
                        if (src == NULL) {
                            continue;
                        }
                        if ((tensor_backend_id(src) != -1 || tensor_backend_id(src->view_src) != -1) && ggml_backend_sched_buffer_supported(sched, src, b)) {
                            n_supported++;
                        }
                    }
                    if (n_supported > n_supported_best) {
                        n_supported_best = n_supported;
                        *node_backend_id = b;
                        SET_CAUSE(node, "3.best");
                    }
                }
            }
        } else {
            // assigned node: upgrade to higher prio backend if possible
            for (int b = 0; b < *node_backend_id; b++) {
                if (sched->bufts[b] == sched->bufts[*node_backend_id] && ggml_backend_supports_op(sched->backends[b], node)) {
                    bool supported = true;
                    for (int j = 0; j < GGML_MAX_SRC; j++) {
                        struct ggml_tensor * src = node->src[j];
                        if (src == NULL) {
                            continue;
                        }
                        if (!ggml_backend_sched_buffer_supported(sched, src, b)) {
                            supported = false;
                            break;
                        }
                    }
                    if (supported) {
                        *node_backend_id = b;
                        SET_CAUSE(node, "3.upg");
                        break;
                    }
                }
            }
        }
    }

    // pass 4: assign backends to remaining src from dst and view_src
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        int * cur_backend_id = &tensor_backend_id(node);
        if (node->view_src != NULL && *cur_backend_id == -1) {
            *cur_backend_id = tensor_backend_id(node->view_src);
            SET_CAUSE(node, "4.vsrc");
        }
        for (int j = 0; j < GGML_MAX_SRC; j++) {
            struct ggml_tensor * src = node->src[j];
            if (src == NULL) {
                continue;
            }
            int * src_backend_id = &tensor_backend_id(src);
            if (*src_backend_id == -1) {
                if (src->view_src != NULL) {
                    // views are always on the same backend as the source
                    *src_backend_id = tensor_backend_id(src->view_src);
                    SET_CAUSE(src, "4.vsrc");
                } else {
                    *src_backend_id = *cur_backend_id;
                    SET_CAUSE(src, "4.cur");
                }
            }
        }
    }

    // pass 5: split graph, find tensors that need to be copied
    {
        int i_split = 0;
        struct ggml_backend_sched_split * split = &sched->splits[0];
        // find the backend of the first split, skipping view ops
        int i = 0;
        for (; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];
            if (!ggml_is_view_op(node->op)) {
                split->backend_id = tensor_backend_id(node);
                break;
            }
        }
        split->i_start = 0;
        split->n_inputs = 0;
        int cur_backend_id = split->backend_id;
        for (; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];

            if (ggml_is_view_op(node->op)) {
                continue;
            }

            const int node_backend_id = tensor_backend_id(node);

            assert(node_backend_id != -1); // all nodes should be assigned by now

            // check if we should start a new split based on the sources of the current node
            bool need_new_split = false;
            if (node_backend_id == cur_backend_id && split->n_inputs > 0) {
                for (int j = 0; j < GGML_MAX_SRC; j++) {
                    struct ggml_tensor * src = node->src[j];
                    if (src == NULL) {
                        continue;
                    }
                    // check if a weight is on a different and incompatible backend
                    // by starting a new split, the memory of the previously offloaded weights can be reused
                    if (src->buffer != NULL && src->buffer->usage == GGML_BACKEND_BUFFER_USAGE_WEIGHTS) {
                        int src_backend_id = tensor_backend_id(src);
                        if (src_backend_id != cur_backend_id && !ggml_backend_sched_buffer_supported(sched, src, cur_backend_id)) {
                            need_new_split = true;
                            break;
                        }
                    }
                    // check if the split has too many inputs
                    // FIXME: count the number of inputs instead of only checking when full
                    if (split->n_inputs == GGML_SCHED_MAX_SPLIT_INPUTS) {
                        const size_t id = hash_id(src);
                        int src_backend_id = sched->hv_tensor_backend_ids[id];
                        bool supported = ggml_backend_sched_buffer_supported(sched, src, cur_backend_id);
                        if (src_backend_id != cur_backend_id && tensor_id_copy(id, cur_backend_id, 0) == NULL && !supported) {
                            need_new_split = true;
                            break;
                        }
                    }
                }
            }

            if (node_backend_id != cur_backend_id || need_new_split) {
                split->i_end = i;
                i_split++;
                if (i_split >= sched->splits_capacity) {
                    sched->splits_capacity *= 2;
                    sched->splits = (ggml_backend_sched_split *)
                        realloc(sched->splits, sched->splits_capacity * sizeof(struct ggml_backend_sched_split));
                    GGML_ASSERT(sched->splits != NULL);
                }
                split = &sched->splits[i_split];
                split->backend_id = node_backend_id;
                split->i_start = i;
                split->n_inputs = 0;
                cur_backend_id = node_backend_id;
            }

            // find inputs that are not on the same backend
            for (int j = 0; j < GGML_MAX_SRC; j++) {
                struct ggml_tensor * src = node->src[j];
                if (src == NULL) {
                    continue;
                }

                size_t src_id = hash_id(src);
                const int src_backend_id = sched->hv_tensor_backend_ids[src_id];
                assert(src_backend_id != -1); // all inputs should be assigned by now

                if (src->flags & GGML_TENSOR_FLAG_INPUT && sched->n_copies > 1) {
                    if (tensor_id_copy(src_id, src_backend_id, 0) == NULL) {
                        ggml_backend_t backend = sched->backends[src_backend_id];
                        for (int c = 0; c < sched->n_copies; c++) {
                            struct ggml_tensor * tensor_copy;
                            if (c == sched->cur_copy) {
                                tensor_copy = src; // use the original tensor as the current copy
                            } else {
                                tensor_copy = ggml_dup_tensor_layout(sched->ctx, src);
                                ggml_format_name(tensor_copy, "%s#%s#%d", ggml_backend_name(backend), src->name, c);
                            }
                            if (sched->n_copies > 1) {
                                ggml_set_input(tensor_copy);
                                ggml_set_output(tensor_copy); // prevent ggml-alloc from overwriting the tensor
                            }
                            tensor_id_copy(src_id, src_backend_id, c) = tensor_copy;
                            SET_CAUSE(tensor_copy, "4.cpy");
                        }
                        int n_graph_inputs = sched->n_graph_inputs++;
                        GGML_ASSERT(n_graph_inputs < GGML_SCHED_MAX_SPLIT_INPUTS);
                        sched->graph_inputs[n_graph_inputs] = src;
                    }
                }

                if (src_backend_id != cur_backend_id && !ggml_backend_sched_buffer_supported(sched, src, cur_backend_id)) {
                    // create a copy of the input in the split's backend
                    if (tensor_id_copy(src_id, cur_backend_id, 0) == NULL) {
                        ggml_backend_t backend = sched->backends[cur_backend_id];
                        for (int c = 0; c < sched->n_copies; c++) {
                            struct ggml_tensor * tensor_copy = ggml_dup_tensor_layout(sched->ctx, src);
                            ggml_format_name(tensor_copy, "%s#%s#%d", ggml_backend_name(backend), src->name, c);
                            if (sched->n_copies > 1) {
                                ggml_set_input(tensor_copy);
                                ggml_set_output(tensor_copy); // prevent ggml-alloc from overwriting the tensor
                            }
                            tensor_id_copy(src_id, cur_backend_id, c) = tensor_copy;
                            SET_CAUSE(tensor_copy, "4.cpy");
                        }
                        int n_inputs = split->n_inputs++;
                        GGML_ASSERT(n_inputs < GGML_SCHED_MAX_SPLIT_INPUTS);
                        split->inputs[n_inputs] = src;
                    }
                    node->src[j] = tensor_id_copy(src_id, cur_backend_id, sched->cur_copy);
                }
            }
        }
        split->i_end = graph->n_nodes;
        sched->n_splits = i_split + 1;
    }

    if (sched->debug) {
        ggml_backend_sched_print_assignments(sched, graph);
    }

    // swap node_backend_ids and leaf _backend_ids with prevs
    {
        int * tmp = sched->node_backend_ids;
        sched->node_backend_ids = sched->prev_node_backend_ids;
        sched->prev_node_backend_ids = tmp;

        tmp = sched->leaf_backend_ids;
        sched->leaf_backend_ids = sched->prev_leaf_backend_ids;
        sched->prev_leaf_backend_ids = tmp;
    }

    int graph_size = std::max(graph->n_nodes, graph->n_leafs) + sched->n_splits*GGML_SCHED_MAX_SPLIT_INPUTS*2*sched->n_copies;
    if (sched->graph.size < graph_size) {
        sched->graph.size = graph_size;
        sched->graph.nodes = (ggml_tensor **) realloc(sched->graph.nodes, graph_size * sizeof(struct ggml_tensor *));
        sched->graph.leafs = (ggml_tensor **) realloc(sched->graph.leafs, graph_size * sizeof(struct ggml_tensor *));
        GGML_ASSERT(sched->graph.nodes != NULL);
        GGML_ASSERT(sched->graph.leafs != NULL);
    }
    sched->graph.n_nodes = 0;
    sched->graph.n_leafs = 0;

    struct ggml_cgraph * graph_copy = &sched->graph;

    for (int i = 0; i < sched->n_splits; i++) {
        struct ggml_backend_sched_split * split = &sched->splits[i];
        split->graph = ggml_graph_view(graph, split->i_start, split->i_end);

        // add inputs to the graph copy so that they are allocated by ggml-alloc at the start of the split
        for (int j = 0; j < split->n_inputs; j++) {
            assert(graph_copy->size > (graph_copy->n_nodes + 1));

            struct ggml_tensor * input = split->inputs[j];
            const size_t input_id = hash_id(input);
            struct ggml_tensor * input_cpy = tensor_id_copy(input_id, split->backend_id, sched->cur_copy);

            // add a dependency to the input source so that it is not freed before the copy is done
            struct ggml_tensor * input_dep = ggml_view_tensor(sched->ctx, input);
            input_dep->src[0] = input;
            sched->node_backend_ids[graph_copy->n_nodes] = sched->hv_tensor_backend_ids[input_id];
            graph_copy->nodes[graph_copy->n_nodes++] = input_dep;

            // add a dependency to the input copy so that it is allocated at the start of the split
            sched->node_backend_ids[graph_copy->n_nodes] = split->backend_id;
            graph_copy->nodes[graph_copy->n_nodes++] = input_cpy;
        }

        for (int j = split->i_start; j < split->i_end; j++) {
            assert(graph_copy->size > graph_copy->n_nodes);
            sched->node_backend_ids[graph_copy->n_nodes] = tensor_backend_id(graph->nodes[j]);
            graph_copy->nodes[graph_copy->n_nodes++] = graph->nodes[j];
        }
    }

    if (sched->n_copies > 1) {
        // add input copies as leafs so that they are allocated first
        for (int i = 0; i < sched->n_graph_inputs; i++) {
            struct ggml_tensor * input = sched->graph_inputs[i];
            size_t id = hash_id(input);
            int backend_id = tensor_backend_id(input);
            for (int c = 0; c < sched->n_copies; c++) {
                struct ggml_tensor * input_cpy = tensor_id_copy(id, backend_id, c);
                sched->leaf_backend_ids[graph_copy->n_leafs] = backend_id;
                assert(graph_copy->size > graph_copy->n_leafs);
                graph_copy->leafs[graph_copy->n_leafs++] = input_cpy;
            }
        }

        for (int i = 0; i < sched->n_splits; i++) {
            struct ggml_backend_sched_split * split = &sched->splits[i];
            int backend_id = split->backend_id;
            for (int j = 0; j < split->n_inputs; j++) {
                struct ggml_tensor * input = split->inputs[j];
                size_t id = hash_id(input);
                for (int c = 0; c < sched->n_copies; c++) {
                    struct ggml_tensor * input_cpy = tensor_id_copy(id, backend_id, c);
                    sched->leaf_backend_ids[graph_copy->n_leafs] = backend_id;
                    assert(graph_copy->size > graph_copy->n_leafs);
                    graph_copy->leafs[graph_copy->n_leafs++] = input_cpy;
                }
            }
        }
    }

    // add leafs from the original graph
    for (int i = 0; i < graph->n_leafs; i++) {
        struct ggml_tensor * leaf = graph->leafs[i];
        sched->leaf_backend_ids[graph_copy->n_leafs] = tensor_backend_id(leaf);
        assert(graph_copy->size > graph_copy->n_leafs);
        graph_copy->leafs[graph_copy->n_leafs++] = leaf;
    }
}